

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,Time *val)

{
  utilities *puVar1;
  int iVar2;
  double dVar3;
  undefined8 this;
  undefined8 __nptr;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  baseType bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  string_view timeString;
  string_view val_00;
  string_view val_01;
  long val_1;
  undefined1 local_68 [48];
  _Uninitialized<double,_true> local_38;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_68);
    goto LAB_002184c4;
  case HELICS_INT:
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_68);
    goto LAB_002185b8;
  case HELICS_COMPLEX:
    local_68._0_8_ = 0.0;
    local_68._8_8_ = 0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_68);
LAB_002184c4:
    bVar10 = 0x7fffffffffffffff;
    if ((double)local_68._0_8_ <= -9223372036.854765) {
      bVar10 = -0x7fffffffffffffff;
    }
    else if ((double)local_68._0_8_ < 9223372036.854765) {
      bVar10 = (baseType)
               ((double)local_68._0_8_ * 1000000000.0 +
               *(double *)
                (&DAT_003d3040 + (ulong)(0.0 <= (double)local_68._0_8_ * 1000000000.0) * 8));
    }
    val->internalTimeCode = bVar10;
    return;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_68,data);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_68,data)
    ;
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_68,data);
    uVar11 = (undefined4)local_68._32_8_;
    uVar12 = SUB84(local_68._32_8_,4);
    if (NAN((double)local_68._32_8_)) goto LAB_00218606;
    goto LAB_0021844d;
  case HELICS_BOOL:
    goto switchD_002182f3_caseD_7;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_68,(helics *)data,(data_view *)val);
      valueExtract((defV *)local_68,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_68);
      return;
    }
    goto switchD_002182f3_caseD_7;
  }
  if (local_68._0_8_ == local_68._8_8_) {
    val->internalTimeCode = 0;
    if ((double)local_68._0_8_ == 0.0) {
      return;
    }
  }
  else {
    lVar7 = 0x7fffffffffffffff;
    dVar3 = *(double *)local_68._0_8_;
    if (dVar3 <= -9223372036.854765) {
      lVar7 = -0x7fffffffffffffff;
    }
    else if (dVar3 < 9223372036.854765) {
      lVar7 = (long)(dVar3 * 1000000000.0 +
                    *(double *)(&DAT_003d3040 + (ulong)(0.0 <= dVar3 * 1000000000.0) * 8));
    }
    val->internalTimeCode = lVar7;
  }
  uVar9 = local_68._16_8_ - local_68._0_8_;
LAB_002185da:
  operator_delete((void *)local_68._0_8_,uVar9);
  return;
switchD_002182f3_caseD_7:
  local_68._0_8_ = 0.0;
  local_68._8_8_ = (double *)0x0;
  detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_68);
  uVar4 = local_68._8_8_;
  this = local_68._0_8_;
  puVar1 = (utilities *)(local_68._8_8_ + local_68._0_8_);
  local_68._0_8_ = (long)local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_68._8_8_,puVar1);
  __nptr = local_68._0_8_;
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *piVar5 = 0;
  pcVar6 = (char *)strtoll((char *)__nptr,(char **)&local_38,10);
  if (local_38._M_storage == (double)__nptr) {
    std::__throw_invalid_argument("stoll");
  }
  else if (*piVar5 != 0x22) {
    if (*piVar5 == 0) {
      *piVar5 = iVar2;
    }
    if (local_68._0_8_ != (long)local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if ((utilities *)(local_38._M_storage - __nptr) == (utilities *)0xffffffffffffffff ||
        local_38._M_storage - __nptr == (double)this) {
      val->internalTimeCode = (baseType)pcVar6;
      return;
    }
    timeString._M_str = pcVar6;
    timeString._M_len = uVar4;
    local_68._0_8_ =
         gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                   ((utilities *)this,timeString);
LAB_002185b8:
    val->internalTimeCode = local_68._0_8_;
    return;
  }
  std::__throw_out_of_range("stoll");
LAB_00218606:
  sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     ".[eE",0,4);
  if (sVar8 == 0xffffffffffffffff) {
    val_01._M_str = (char *)local_68._0_8_;
    val_01._M_len = local_68._8_8_;
    lVar7 = getIntFromString(val_01);
  }
  else {
    val_00._M_str = (char *)local_68._0_8_;
    val_00._M_len = local_68._8_8_;
    dVar3 = getDoubleFromString(val_00);
    uVar11 = SUB84(dVar3,0);
    uVar12 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_0021844d:
    lVar7 = 0x7fffffffffffffff;
    if ((double)CONCAT44(uVar12,uVar11) < -9223372036.854765 ||
        (double)CONCAT44(uVar12,uVar11) == -9223372036.854765) {
      lVar7 = -0x7fffffffffffffff;
    }
    else if ((double)CONCAT44(uVar12,uVar11) <= 9223372036.854765 &&
             (double)CONCAT44(uVar12,uVar11) != 9223372036.854765) {
      dVar3 = (double)CONCAT44(uVar12,uVar11) * 1000000000.0;
      lVar7 = (long)(dVar3 + *(double *)(&DAT_003d3040 + (ulong)(0.0 <= dVar3) * 8));
    }
  }
  val->internalTimeCode = lVar7;
  if (local_68._0_8_ == (long)local_68 + 0x10) {
    return;
  }
  uVar9 = local_68._16_8_ + 1;
  goto LAB_002185da;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, Time& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = ValueConverter<double>::interpret(data);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            val.setBaseTimeCode(ValueConverter<int64_t>::interpret(data));
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            size_t index;
            try {
                auto stringData = ValueConverter<std::string_view>::interpret(data);
                auto timeCode = std::stoll(std::string(stringData), &index);
                if ((index == std::string::npos) || (index == stringData.size())) {
                    val.setBaseTimeCode(timeCode);
                } else {
                    val = gmlc::utilities::loadTimeFromString<helics::Time>(stringData);
                }
            }
            catch (...) {
                val = timeZero;
            }

            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            val = (!vec.empty()) ? Time(vec[0]) : timeZero;
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val = cval.real();
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (!cvec.empty()) ? Time(cvec[0].real()) : timeZero;
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto point = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(point.value)) {
                if (point.name.find(".[eE") == std::string::npos) {
                    const std::int64_t intVal = getIntFromString(point.name);
                    val.setBaseTimeCode(intVal);
                } else {
                    val = getDoubleFromString(point.name);
                }
            } else {
                val = point.value;
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}